

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanLogicalDevice::FreeDescriptorSet
          (VulkanLogicalDevice *this,VkDescriptorPool Pool,VkDescriptorSet Set)

{
  undefined8 in_RCX;
  VkDescriptorSet Set_local;
  string msg;
  
  Set_local = Set;
  if (Pool == (VkDescriptorPool)0x0 || Set == (VkDescriptorSet)0x0) {
    Diligent::FormatString<char[26],char[48]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Pool != VK_NULL_HANDLE && Set != VK_NULL_HANDLE",
               (char (*) [48])CONCAT71((int7)((ulong)in_RCX >> 8),Set != (VkDescriptorSet)0x0));
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"FreeDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x232);
    std::__cxx11::string::~string((string *)&msg);
  }
  (*vkFreeDescriptorSets)(this->m_VkDevice,Pool,1,&Set_local);
  return;
}

Assistant:

void VulkanLogicalDevice::FreeDescriptorSet(VkDescriptorPool Pool, VkDescriptorSet Set) const
{
    VERIFY_EXPR(Pool != VK_NULL_HANDLE && Set != VK_NULL_HANDLE);
    vkFreeDescriptorSets(m_VkDevice, Pool, 1, &Set);
}